

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O3

Aig_Man_t * Cgt_ManDeriveAigForGating(Cgt_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  void **__s;
  Vec_Ptr_t *vCopy1;
  void **__s_00;
  uint uVar8;
  uint uVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  Aig_Obj_t *p1;
  int iVar12;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  Aig_Man_t *pAVar16;
  int iVar17;
  long lVar18;
  
  if (p->pAig->nRegs == 0) {
    __assert_fail("Aig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtAig.c"
                  ,0x110,"Aig_Man_t *Cgt_ManDeriveAigForGating(Cgt_Man_t *)");
  }
  p_00 = Aig_ManStart(p->pAig->vObjs->nSize);
  pcVar4 = (char *)malloc(9);
  builtin_strncpy(pcVar4,"CG_miter",9);
  p_00->pName = pcVar4;
  p->pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pAVar16 = p->pAig;
  pVVar7 = pAVar16->vCis;
  if (0 < pVVar7->nSize) {
    lVar18 = 0;
    do {
      pvVar13 = pVVar7->pArray[lVar18];
      pAVar5 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar5;
      lVar18 = lVar18 + 1;
      pAVar16 = p->pAig;
      pVVar7 = pAVar16->vCis;
    } while (lVar18 < pVVar7->nSize);
  }
  pVVar7 = pAVar16->vObjs;
  uVar8 = pVVar7->nSize;
  if (0 < (int)uVar8) {
    lVar18 = 0;
    do {
      pvVar13 = pVVar7->pArray[lVar18];
      if ((pvVar13 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar13 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar13 & 1) != 0) goto LAB_008eee25;
        uVar6 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar13 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar13 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28))
          ;
        }
        pAVar5 = Aig_And(p_00,pAVar5,pAVar10);
        *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar5;
        pAVar16 = p->pAig;
      }
      lVar18 = lVar18 + 1;
      pVVar7 = pAVar16->vObjs;
      uVar8 = pVVar7->nSize;
    } while (lVar18 < (int)uVar8);
  }
  if (p->pPars->nOdcMax < 1) {
    if (0 < pAVar16->nRegs) {
      iVar17 = 0;
      do {
        uVar8 = pAVar16->nTruePos + iVar17;
        if (((((int)uVar8 < 0) || (pAVar16->vCos->nSize <= (int)uVar8)) ||
            (uVar2 = pAVar16->nTruePis + iVar17, (int)uVar2 < 0)) ||
           (pAVar16->vCis->nSize <= (int)uVar2)) goto LAB_008eede7;
        pvVar13 = pAVar16->vCos->pArray[uVar8];
        if (((ulong)pvVar13 & 1) != 0) goto LAB_008eee25;
        uVar6 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar5 = Aig_Exor(p_00,*(Aig_Obj_t **)((long)pAVar16->vCis->pArray[uVar2] + 0x28),pAVar5);
        pAVar5 = Aig_ObjCreateCo(p_00,pAVar5);
        *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar5;
        iVar17 = iVar17 + 1;
        pAVar16 = p->pAig;
      } while (iVar17 < pAVar16->nRegs);
    }
    goto LAB_008eedc5;
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar2 = uVar8;
  if (uVar8 - 1 < 7) {
    uVar2 = 8;
  }
  pVVar7->nCap = uVar2;
  if (uVar2 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar2 << 3);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = uVar8;
  memset(__s,0,(long)(int)uVar8 << 3);
  uVar2 = pAVar16->vObjs->nSize;
  vCopy1 = (Vec_Ptr_t *)malloc(0x10);
  uVar3 = 8;
  if (6 < uVar2 - 1) {
    uVar3 = uVar2;
  }
  vCopy1->nCap = uVar3;
  if (uVar3 == 0) {
    __s_00 = (void **)0x0;
  }
  else {
    __s_00 = (void **)malloc((long)(int)uVar3 << 3);
  }
  vCopy1->pArray = __s_00;
  vCopy1->nSize = uVar2;
  memset(__s_00,0,(long)(int)uVar2 << 3);
  iVar17 = pAVar16->nRegs;
  if ((long)iVar17 < 1) {
    if (__s != (void **)0x0) goto LAB_008eed95;
  }
  else {
    iVar1 = pAVar16->nTruePos;
    lVar18 = (long)iVar1;
    lVar11 = 0;
    do {
      if ((iVar1 < 0) || (pAVar16->vCos->nSize <= lVar18)) goto LAB_008eede7;
      uVar6 = (ulong)(uint)pAVar16->nTruePis + lVar11;
      iVar12 = (int)uVar6;
      if ((iVar12 < 0) || (pAVar16->vCis->nSize <= iVar12)) goto LAB_008eede7;
      pvVar13 = pAVar16->vCos->pArray[lVar18];
      if (((ulong)pvVar13 & 1) != 0) goto LAB_008eee25;
      uVar15 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
      if (uVar15 == 0) {
        pvVar14 = (void *)0x0;
      }
      else {
        pvVar14 = (void *)((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^
                          *(ulong *)(uVar15 + 0x28));
      }
      uVar3 = *(uint *)((long)pAVar16->vCis->pArray[uVar6 & 0xffffffff] + 0x24);
      if (((int)uVar3 < 0) || ((int)uVar8 <= (int)uVar3)) goto LAB_008eee06;
      __s[uVar3] = pvVar14;
      uVar6 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = (void *)((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^
                          *(ulong *)(uVar6 + 0x28));
      }
      if ((int)uVar2 <= (int)uVar3) goto LAB_008eee06;
      __s_00[uVar3] = pvVar13;
      lVar11 = lVar11 + 1;
      lVar18 = lVar18 + 1;
    } while (iVar17 != lVar11);
    if (0 < iVar17) {
      iVar17 = 0;
      do {
        uVar3 = pAVar16->nTruePos + iVar17;
        if (((((int)uVar3 < 0) || (pAVar16->vCos->nSize <= (int)uVar3)) ||
            (uVar9 = pAVar16->nTruePis + iVar17, (int)uVar9 < 0)) ||
           (pAVar16->vCis->nSize <= (int)uVar9)) {
LAB_008eede7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar5 = (Aig_Obj_t *)pAVar16->vCis->pArray[uVar9];
        uVar9 = pAVar5->Id;
        lVar18 = (long)(int)uVar9;
        if ((lVar18 < 0) || ((int)uVar8 <= (int)uVar9)) {
LAB_008eee06:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        pvVar13 = pAVar16->vCos->pArray[uVar3];
        __s[lVar18] = (void *)((ulong)p_00->pConst1 ^ 1);
        if (uVar2 <= uVar9) goto LAB_008eee06;
        __s_00[lVar18] = p_00->pConst1;
        pAVar10 = Cgt_ManConstructCareCondition(p,p_00,pAVar5,pVVar7,vCopy1);
        if (((ulong)pvVar13 & 1) != 0) {
LAB_008eee25:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar6 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pvVar14 = (void *)0x0;
        }
        else {
          pvVar14 = (void *)((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^
                            *(ulong *)(uVar6 + 0x28));
        }
        uVar3 = pAVar5->Id;
        if (((int)uVar3 < 0) || (uVar8 <= uVar3)) goto LAB_008eee06;
        __s[uVar3] = pvVar14;
        uVar6 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pvVar14 = (void *)0x0;
        }
        else {
          pvVar14 = (void *)((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^
                            *(ulong *)(uVar6 + 0x28));
        }
        if (uVar2 <= uVar3) goto LAB_008eee06;
        __s_00[uVar3] = pvVar14;
        uVar6 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar5 = Aig_Exor(p_00,(Aig_Obj_t *)(pAVar5->field_5).pData,p1);
        pAVar5 = Aig_And(p_00,pAVar5,pAVar10);
        pAVar5 = Aig_ObjCreateCo(p_00,pAVar5);
        *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar5;
        iVar17 = iVar17 + 1;
        pAVar16 = p->pAig;
      } while (iVar17 < pAVar16->nRegs);
    }
LAB_008eed95:
    free(__s);
  }
  free(pVVar7);
  if (__s_00 != (void **)0x0) {
    free(__s_00);
  }
  free(vCopy1);
LAB_008eedc5:
  Aig_ManCleanup(p_00);
  Aig_ManSetCioIds(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Cgt_ManDeriveAigForGating( Cgt_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pCare, * pMiter;
    Vec_Ptr_t * vCopy0, * vCopy1;
    int i;
    assert( Aig_ManRegNum(p->pAig) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p->pAig) );
    pNew->pName = Abc_UtilStrsav( "CG_miter" );
    // build the first frame
    Aig_ManConst1(p->pAig)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p->pAig, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
//    Saig_ManForEachPo( p->pAig, pObj, i )
//        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    if ( p->pPars->nOdcMax > 0 )
    {
        // create storage for observability conditions
        vCopy0 = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
        vCopy1 = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
        // initialize register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
        }
        // compute observability condition for each latch output
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            // set the constants
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ManConst0(pNew) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ManConst1(pNew) );
            // compute condition
            pCare = Cgt_ManConstructCareCondition( p, pNew, pObjLo, vCopy0, vCopy1 );
            // restore the values
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            // compute the miter
            pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
            pMiter = Aig_And( pNew, pMiter, pCare );
            pObjLi->pData = Aig_ObjCreateCo( pNew, pMiter );
        }
        Vec_PtrFree( vCopy0 );
        Vec_PtrFree( vCopy1 );
    }
    else
    {
        // construct clock-gating miters for each register input
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
            pObjLi->pData = Aig_ObjCreateCo( pNew, pMiter );
        }
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetCioIds( pNew );
    return pNew;
}